

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

LY_ERR yang_print_parsed_module(ly_out *out,lysp_module *modp,uint32_t options)

{
  char *text;
  uint local_84;
  lys_module *local_78;
  lys_ypr_ctx *pctx;
  lys_ypr_ctx pctx_;
  lys_module *module;
  uint64_t u;
  uint32_t options_local;
  lysp_module *modp_local;
  ly_out *out_local;
  
  pctx_.field_0._8_8_ = modp->mod;
  pctx_.field_0._0_2_ = 0;
  pctx_.field_0._2_2_ = 0;
  pctx_.field_0._16_4_ = 0;
  pctx = (lys_ypr_ctx *)out;
  pctx_.field_0._4_4_ = options;
  pctx_._24_8_ = pctx_.field_0._8_8_;
  ly_print_(out,"%*smodule %s {\n",0,"");
  pctx_.field_0._0_2_ = pctx_.field_0._0_2_ + 1;
  if (modp->version != '\0') {
    text = "1";
    if (modp->version == '\x02') {
      text = "1.1";
    }
    ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_YANG_VERSION,'\0',text,'\0',modp->exts);
  }
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_NAMESPACE,'\0',*(char **)(pctx_._24_8_ + 0x18),'\0',
              modp->exts);
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_PREFIX,'\0',*(char **)(pctx_._24_8_ + 0x20),'\0',
              modp->exts);
  pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
  yang_print_parsed_linkage((lys_ypr_ctx *)&pctx,modp);
  if (((((*(long *)(pctx_._24_8_ + 0x30) != 0) || (*(long *)(pctx_._24_8_ + 0x38) != 0)) ||
       (*(long *)(pctx_._24_8_ + 0x40) != 0)) || (*(long *)(pctx_._24_8_ + 0x48) != 0)) &&
     (((pctx_.field_0._2_2_ & 1) != 0 &&
      (pctx_.field_0._2_2_ = pctx_.field_0._2_2_ & 0xfffe, (pctx_.field_0._4_4_ & 2) == 0)))) {
    ly_print_((ly_out *)pctx,"\n");
  }
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_ORGANIZATION,'\0',*(char **)(pctx_._24_8_ + 0x30),'\0',
              modp->exts);
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_CONTACT,'\0',*(char **)(pctx_._24_8_ + 0x38),'\0',
              modp->exts);
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_DESCRIPTION,'\0',*(char **)(pctx_._24_8_ + 0x40),'\0',
              modp->exts);
  ypr_substmt((lys_ypr_ctx *)&pctx,LY_STMT_REFERENCE,'\0',*(char **)(pctx_._24_8_ + 0x48),'\0',
              modp->exts);
  if (((*(long *)(pctx_._24_8_ + 0x30) != 0) || (*(long *)(pctx_._24_8_ + 0x38) != 0)) ||
     ((*(long *)(pctx_._24_8_ + 0x40) != 0 || (*(long *)(pctx_._24_8_ + 0x48) != 0)))) {
    pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
  }
  module = (lys_module *)0x0;
  while( true ) {
    if (modp->revs == (lysp_revision *)0x0) {
      local_78 = (lys_module *)0x0;
    }
    else {
      local_78 = (lys_module *)modp->revs[-1].exts;
    }
    if (local_78 <= module) break;
    if (((pctx_.field_0._2_2_ & 1) != 0) &&
       (pctx_.field_0._2_2_ = pctx_.field_0._2_2_ & 0xfffe, (pctx_.field_0._4_4_ & 2) == 0)) {
      ly_print_((ly_out *)pctx,"\n");
    }
    yprp_revision((lys_ypr_ctx *)&pctx,modp->revs + (long)module);
    module = (lys_module *)((long)&module->ctx + 1);
  }
  if (modp->revs != (lysp_revision *)0x0) {
    pctx_.field_0._2_2_ = pctx_.field_0._2_2_ | 1;
  }
  yang_print_parsed_body((lys_ypr_ctx *)&pctx,modp);
  pctx_.field_0._0_2_ = pctx_.field_0._0_2_ - 1;
  if ((pctx_.field_0._4_4_ & 2) == 0) {
    local_84 = (uint)(ushort)pctx_.field_0._0_2_ << 1;
  }
  else {
    local_84 = 0;
  }
  ly_print_(out,"%*s}\n",(ulong)local_84,"");
  ly_print_flush(out);
  return LY_SUCCESS;
}

Assistant:

LY_ERR
yang_print_parsed_module(struct ly_out *out, const struct lysp_module *modp, uint32_t options)
{
    LY_ARRAY_COUNT_TYPE u;
    const struct lys_module *module = modp->mod;
    struct lys_ypr_ctx pctx_ = {
        .out = out,
        .level = 0,
        .options = options,
        .module = module,
        .schema = LYS_YPR_PARSED
    }, *pctx = &pctx_;

    ly_print_(pctx->out, "%*smodule %s {\n", INDENT, module->name);
    LEVEL++;

    /* module-header-stmts */
    if (modp->version) {
        ypr_substmt(pctx, LY_STMT_YANG_VERSION, 0, modp->version == LYS_VERSION_1_1 ? "1.1" : "1", 0, modp->exts);
    }
    ypr_substmt(pctx, LY_STMT_NAMESPACE, 0, module->ns, 0, modp->exts);
    ypr_substmt(pctx, LY_STMT_PREFIX, 0, module->prefix, 0, modp->exts);

    YPR_EXTRA_LINE(1, pctx);

    /* linkage-stmts (import/include) */
    yang_print_parsed_linkage(pctx, modp);

    /* meta-stmts */
    if (module->org || module->contact || module->dsc || module->ref) {
        YPR_EXTRA_LINE_PRINT(pctx);
    }
    ypr_substmt(pctx, LY_STMT_ORGANIZATION, 0, module->org, 0, modp->exts);
    ypr_substmt(pctx, LY_STMT_CONTACT, 0, module->contact, 0, modp->exts);
    ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, module->dsc, 0, modp->exts);
    ypr_substmt(pctx, LY_STMT_REFERENCE, 0, module->ref, 0, modp->exts);

    YPR_EXTRA_LINE(module->org || module->contact || module->dsc || module->ref, pctx);

    /* revision-stmts */
    LY_ARRAY_FOR(modp->revs, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_revision(pctx, &modp->revs[u]);
    }

    YPR_EXTRA_LINE(modp->revs, pctx);

    /* body-stmts */
    yang_print_parsed_body(pctx, modp);

    LEVEL--;
    ly_print_(out, "%*s}\n", INDENT);
    ly_print_flush(out);

    return LY_SUCCESS;
}